

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O2

REF_STATUS
ref_iso_boom_zone(FILE *file,REF_GRID ref_grid,REF_DBL *field,REF_INT ldim,REF_DBL *center,
                 REF_DBL aoa,REF_DBL phi,REF_DBL h)

{
  REF_MPI pRVar1;
  REF_NODE pRVar2;
  REF_INT n_00;
  uint uVar3;
  int iVar4;
  long lVar5;
  void *my_array;
  ulong uVar6;
  REF_DBL *pRVar7;
  REF_DBL *pRVar8;
  REF_INT *sorted_index;
  int ldim_00;
  ulong uVar9;
  undefined8 uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  char *pcVar16;
  long lVar17;
  REF_INT n;
  FILE *local_e8;
  REF_DBL *xyzf;
  REF_GRID ray_grid;
  REF_MPI local_d0;
  REF_DBL local_c8;
  REF_DBL local_c0;
  REF_INT *source;
  REF_DBL *ray_field;
  REF_DBL ds [3];
  REF_DBL dt [3];
  REF_DBL segment0 [3];
  REF_DBL segment1 [3];
  
  pRVar1 = ref_grid->mpi;
  local_c8 = phi;
  local_c0 = h;
  uVar3 = ref_iso_segment(ref_grid,center,aoa,phi,h,segment0,segment1);
  if (uVar3 == 0) {
    for (lVar5 = 0; lVar5 != 3; lVar5 = lVar5 + 1) {
      ds[lVar5] = segment1[lVar5] - segment0[lVar5];
    }
    local_e8 = (FILE *)file;
    local_d0 = pRVar1;
    uVar3 = ref_math_normalize(ds);
    if (uVar3 == 0) {
      uVar3 = ref_iso_cast(&ray_grid,&ray_field,ref_grid,field,ldim,segment0,segment1);
      if (uVar3 == 0) {
        pRVar2 = ray_grid->node;
        uVar9 = 0;
        uVar13 = (ulong)(uint)pRVar2->max;
        if (pRVar2->max < 1) {
          uVar13 = uVar9;
        }
        iVar4 = 0;
        for (; uVar13 != uVar9; uVar9 = uVar9 + 1) {
          if (-1 < pRVar2->global[uVar9]) {
            iVar4 = iVar4 + (uint)(pRVar2->ref_mpi->id == pRVar2->part[uVar9]);
          }
        }
        lVar5 = (long)ldim + 3;
        ldim_00 = (int)lVar5;
        if (iVar4 * ldim_00 < 0) {
          pcVar16 = "malloc local_xyzf of REF_DBL negative";
          uVar10 = 0x344;
LAB_00169b9c:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                 uVar10,"ref_iso_boom_zone",pcVar16);
          return 1;
        }
        my_array = malloc((ulong)(uint)(iVar4 * ldim_00) << 3);
        if (my_array == (void *)0x0) {
          pcVar16 = "malloc local_xyzf of REF_DBL NULL";
          uVar10 = 0x344;
        }
        else {
          uVar6 = 0;
          uVar9 = (ulong)(uint)ldim;
          if (ldim < 1) {
            uVar9 = uVar6;
          }
          iVar4 = 0;
          pRVar7 = ray_field;
          for (uVar11 = 0; uVar11 != uVar13; uVar11 = uVar11 + 1) {
            if ((-1 < pRVar2->global[uVar11]) && (pRVar2->ref_mpi->id == pRVar2->part[uVar11])) {
              pRVar8 = pRVar2->real;
              for (lVar17 = 0; lVar17 != 3; lVar17 = lVar17 + 1) {
                *(undefined8 *)((long)my_array + lVar17 * 8 + (long)(iVar4 * ldim_00) * 8) =
                     *(undefined8 *)((long)pRVar8 + lVar17 * 8 + uVar6);
              }
              for (uVar15 = 0; uVar9 != uVar15; uVar15 = uVar15 + 1) {
                *(REF_DBL *)((long)my_array + (long)(iVar4 * ldim_00 + 3 + (int)uVar15) * 8) =
                     pRVar7[uVar15];
              }
              iVar4 = iVar4 + 1;
            }
            uVar6 = uVar6 + 0x78;
            pRVar7 = pRVar7 + ldim;
          }
          free(ray_field);
          ref_grid_free(ray_grid);
          pRVar1 = local_d0;
          uVar3 = ref_mpi_allconcat(local_d0,ldim_00,iVar4,my_array,&n,&source,&xyzf,3);
          if (uVar3 != 0) {
            uVar13 = (ulong)uVar3;
            pcVar16 = "concat";
            uVar10 = 0x354;
            goto LAB_001699d4;
          }
          free(my_array);
          if (pRVar1->id != 0) {
            return 0;
          }
          free(source);
          n_00 = n;
          lVar17 = (long)n;
          if (lVar17 < 0) {
            pcVar16 = "malloc t of REF_DBL negative";
            uVar10 = 0x358;
            goto LAB_00169b9c;
          }
          pRVar7 = (REF_DBL *)malloc(lVar17 * 8);
          if (pRVar7 == (REF_DBL *)0x0) {
            pcVar16 = "malloc t of REF_DBL NULL";
            uVar10 = 0x358;
          }
          else {
            pRVar8 = xyzf;
            for (lVar12 = 0; lVar12 != lVar17; lVar12 = lVar12 + 1) {
              for (lVar14 = 0; lVar14 != 3; lVar14 = lVar14 + 1) {
                dt[lVar14] = pRVar8[lVar14] - segment0[lVar14];
              }
              pRVar7[lVar12] = dt[2] * ds[2] + dt[0] * ds[0] + dt[1] * ds[1];
              pRVar8 = pRVar8 + ldim_00;
            }
            sorted_index = (REF_INT *)malloc(lVar17 * 4);
            if (sorted_index != (REF_INT *)0x0) {
              uVar3 = ref_sort_heap_dbl(n_00,pRVar7,sorted_index);
              if (uVar3 == 0) {
                fprintf(local_e8," zone t=\"PHI=%.1f,R=%.1f\"\n",local_c8,local_c0);
                lVar17 = 0;
                iVar4 = 0;
                if (0 < ldim_00) {
                  iVar4 = ldim_00;
                }
                for (; lVar17 < n; lVar17 = lVar17 + 1) {
                  for (lVar12 = 0; iVar4 != (int)lVar12; lVar12 = lVar12 + 1) {
                    fprintf(local_e8," %.15e",xyzf[sorted_index[lVar17] * lVar5 + lVar12]);
                  }
                  fputc(10,local_e8);
                }
                free(sorted_index);
                free(pRVar7);
                free(xyzf);
                return 0;
              }
              uVar13 = (ulong)uVar3;
              pcVar16 = "sort t";
              uVar10 = 0x35f;
              goto LAB_001699d4;
            }
            pcVar16 = "malloc order of REF_INT NULL";
            uVar10 = 0x35e;
          }
        }
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
               uVar10,"ref_iso_boom_zone",pcVar16);
        return 2;
      }
      uVar13 = (ulong)uVar3;
      pcVar16 = "cast";
      uVar10 = 0x33c;
    }
    else {
      uVar13 = (ulong)uVar3;
      pcVar16 = "segment unit vector";
      uVar10 = 0x338;
    }
  }
  else {
    uVar13 = (ulong)uVar3;
    pcVar16 = "seg";
    uVar10 = 0x336;
  }
LAB_001699d4:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",uVar10,
         "ref_iso_boom_zone",uVar13,pcVar16);
  return (REF_STATUS)uVar13;
}

Assistant:

REF_FCN REF_STATUS ref_iso_boom_zone(FILE *file, REF_GRID ref_grid,
                                     REF_DBL *field, REF_INT ldim,
                                     REF_DBL *center, REF_DBL aoa, REF_DBL phi,
                                     REF_DBL h) {
  REF_DBL segment0[3], segment1[3], ds[3], dt[3];
  REF_GRID ray_grid;
  REF_DBL *ray_field;
  REF_DBL *local_xyzf, *xyzf, *t;
  REF_NODE ref_node;
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INT node, local_n, n, *source, i, *order;

  RSS(ref_iso_segment(ref_grid, center, aoa, phi, h, segment0, segment1),
      "seg");
  for (i = 0; i < 3; i++) ds[i] = segment1[i] - segment0[i];
  RSS(ref_math_normalize(ds), "segment unit vector");

  RSS(ref_iso_cast(&ray_grid, &ray_field, ref_grid, field, ldim, segment0,
                   segment1),
      "cast");
  ref_node = ref_grid_node(ray_grid);
  local_n = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      local_n++;
    }
  }
  ref_malloc(local_xyzf, local_n * (3 + ldim), REF_DBL);
  local_n = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      for (i = 0; i < 3; i++)
        local_xyzf[i + (3 + ldim) * local_n] = ref_node_xyz(ref_node, i, node);
      for (i = 0; i < ldim; i++)
        local_xyzf[3 + i + (3 + ldim) * local_n] = ray_field[i + node * ldim];
      local_n++;
    }
  }
  ref_free(ray_field);
  ref_grid_free(ray_grid);

  RSS(ref_mpi_allconcat(ref_mpi, 3 + ldim, local_n, local_xyzf, &n, &source,
                        (void **)(&xyzf), REF_DBL_TYPE),
      "concat");
  ref_free(local_xyzf);
  if (ref_mpi_once(ref_mpi)) {
    ref_free(source);
    ref_malloc(t, n, REF_DBL);

    for (node = 0; node < n; node++) {
      for (i = 0; i < 3; i++) dt[i] = xyzf[i + (3 + ldim) * node] - segment0[i];
      t[node] = ref_math_dot(dt, ds);
    }
    ref_malloc(order, n, REF_INT);
    RSS(ref_sort_heap_dbl(n, t, order), "sort t");
    fprintf(file, " zone t=\"PHI=%.1f,R=%.1f\"\n", phi, h);
    for (node = 0; node < n; node++) {
      for (i = 0; i < 3 + ldim; i++) {
        fprintf(file, " %.15e", xyzf[i + (3 + ldim) * order[node]]);
      }
      fprintf(file, "\n");
    }
    ref_free(order);
    ref_free(t);
    ref_free(xyzf);
  }

  return REF_SUCCESS;
}